

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int arg_nullcheck(void **argtable)

{
  byte *pbVar1;
  int iVar2;
  arg_hdr **table;
  
  iVar2 = 1;
  if (argtable != (void **)0x0) {
    do {
      pbVar1 = (byte *)*argtable;
      if (pbVar1 == (byte *)0x0) {
        return 1;
      }
      argtable = argtable + 1;
    } while ((*pbVar1 & 1) == 0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arg_nullcheck(void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;
    /*printf("arg_nullcheck(%p)\n",argtable);*/

    if (!table)
        return 1;

    tabindex = 0;
    do {
        /*printf("argtable[%d]=%p\n",tabindex,argtable[tabindex]);*/
        if (!table[tabindex])
            return 1;
    } while (!(table[tabindex++]->flag & ARG_TERMINATOR));

    return 0;
}